

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O3

void brotli::BuildAndStoreHuffmanTreeFast
               (uint32_t *histogram,size_t histogram_total,size_t max_bits,uint8_t *depth,
               uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  HuffmanTree *__dest;
  uint uVar1;
  uint uVar2;
  HuffmanTree HVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  HuffmanTree *__i;
  ulong uVar9;
  HuffmanTree *pool;
  long lVar10;
  HuffmanTree *pHVar11;
  HuffmanTree *pHVar12;
  HuffmanTree *pHVar13;
  HuffmanTree *pHVar14;
  byte *pbVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  size_t __n;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  size_t sVar28;
  value_type __val_1;
  HuffmanTree *pHVar29;
  value_type __val;
  ulong uVar30;
  bool bVar31;
  size_t symbols [4];
  uint local_cc;
  ulong local_98 [5];
  HuffmanTree *local_70;
  uint32_t *local_68;
  size_t local_60;
  uint16_t *local_58;
  ulong local_50;
  HuffmanTree *local_48;
  uint8_t *local_40;
  long local_38;
  
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_68 = histogram;
  if (histogram_total == 0) {
LAB_00176ae8:
    uVar9 = *storage_ix;
    *(ulong *)(storage + (uVar9 >> 3)) = (ulong)storage[uVar9 >> 3] | 1L << ((byte)uVar9 & 7);
    uVar9 = uVar9 + 4;
    *storage_ix = uVar9;
    if (local_98[0] >> ((byte)max_bits & 0x3f) != 0) {
LAB_00177400:
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                    ,0x2c,
                    "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                   );
    }
    uVar21 = local_98[0];
    if (0x38 < max_bits) {
LAB_0017741f:
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/deps/brotli/enc/././write_bits.h"
                    ,0x2d,
                    "void brotli::WriteBits(size_t, uint64_t, size_t *__restrict, uint8_t *__restrict)"
                   );
    }
  }
  else {
    uVar21 = 0;
    lVar5 = 0xffff00000000;
    uVar9 = 0;
    do {
      uVar24 = uVar9;
      lVar10 = lVar5;
      uVar20 = histogram[uVar24];
      if ((ulong)uVar20 != 0) {
        if (uVar21 < 4) {
          local_98[uVar21] = uVar24;
        }
        uVar21 = uVar21 + 1;
        histogram_total = histogram_total - uVar20;
      }
      uVar9 = uVar24 + 1;
      lVar5 = lVar10 + 0x1000000000000;
    } while (histogram_total != 0);
    if (uVar21 < 2) goto LAB_00176ae8;
    local_60 = max_bits;
    local_58 = bits;
    local_50 = uVar21;
    pool = (HuffmanTree *)malloc(uVar9 * 0x10 | 8);
    local_70 = pool + -1;
    __dest = pool + 1;
    local_48 = pool + 0x10;
    local_40 = depth + 1;
    local_cc = 1;
    local_38 = lVar10;
    do {
      pbVar15 = depth;
      if (uVar9 == 0) {
        pool->total_count_ = 0x7fffffff;
        pool->index_left_ = -1;
        pool->index_right_or_value_ = -1;
        pool[1].total_count_ = 0x7fffffff;
        pool[1].index_left_ = -1;
        pool[1].index_right_or_value_ = -1;
        SetDepth(local_70,pool,depth,'\0');
      }
      else {
        uVar27 = 0;
        uVar21 = uVar9;
        pHVar29 = pool;
        do {
          uVar20 = local_68[uVar21 - 1];
          if (uVar20 != 0) {
            if (uVar20 <= local_cc) {
              uVar20 = local_cc;
            }
            *pHVar29 = (HuffmanTree)((ulong)uVar20 + lVar10);
            uVar27 = uVar27 + 8;
          }
          uVar21 = uVar21 - 1;
          pHVar29 = (HuffmanTree *)((long)&pool->total_count_ + uVar27);
          lVar10 = lVar10 + -0x1000000000000;
        } while (uVar21 != 0);
        if (uVar27 != 0) {
          lVar5 = 0x3f;
          if ((long)uVar27 >> 3 != 0) {
            for (; (ulong)((long)uVar27 >> 3) >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          std::
          __introsort_loop<brotli::HuffmanTree*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(brotli::HuffmanTree_const&,brotli::HuffmanTree_const&)>>
                    (pool,pHVar29,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<bool_(*)(const_brotli::HuffmanTree_&,_const_brotli::HuffmanTree_&)>
                      )0x179cdf);
          if ((long)uVar27 < 0x81) {
            pHVar14 = __dest;
            pHVar11 = pool;
            if (uVar27 != 8) {
              do {
                pHVar13 = pHVar14;
                HVar3 = *pHVar13;
                if (pHVar13->total_count_ < pool->total_count_) {
                  memmove((void *)((long)pHVar11 + (0x10 - ((long)pHVar13 - (long)pool))),pool,
                          (long)pHVar13 - (long)pool);
                  pHVar14 = pool;
                }
                else {
                  uVar20 = pHVar11->total_count_;
                  pHVar14 = pHVar13;
                  while (HVar3.total_count_ < uVar20) {
                    *pHVar14 = pHVar14[-1];
                    uVar20 = pHVar14[-2].total_count_;
                    pHVar14 = pHVar14 + -1;
                  }
                }
                *pHVar14 = HVar3;
                pHVar14 = pHVar13 + 1;
                pHVar11 = pHVar13;
              } while (pHVar13 + 1 != pHVar29);
            }
          }
          else {
            __n = 8;
            pHVar14 = __dest;
            pHVar11 = pool;
            do {
              pHVar13 = (HuffmanTree *)((long)&pool->total_count_ + __n);
              HVar3 = *(HuffmanTree *)((long)&pool->total_count_ + __n);
              if (*(uint *)((long)&pool->total_count_ + __n) < pool->total_count_) {
                memmove(__dest,pool,__n);
                pHVar11 = pool;
              }
              else {
                uVar20 = pHVar11->total_count_;
                pHVar11 = pHVar13;
                pHVar12 = pHVar14;
                while (HVar3.total_count_ < uVar20) {
                  pHVar11 = pHVar12 + -1;
                  *pHVar12 = pHVar12[-1];
                  uVar20 = pHVar12[-2].total_count_;
                  pHVar12 = pHVar11;
                }
              }
              *pHVar11 = HVar3;
              __n = __n + 8;
              pHVar14 = pHVar14 + 1;
              pHVar12 = local_48;
              pHVar11 = pHVar13;
            } while (__n != 0x80);
            do {
              HVar3 = *pHVar12;
              uVar20 = pHVar12[-1].total_count_;
              pHVar14 = pHVar12;
              while (HVar3.total_count_ < uVar20) {
                *pHVar14 = pHVar14[-1];
                uVar20 = pHVar14[-2].total_count_;
                pHVar14 = pHVar14 + -1;
              }
              *pHVar14 = HVar3;
              pHVar12 = pHVar12 + 1;
            } while (pHVar12 != pHVar29);
          }
        }
        pHVar29->total_count_ = 0x7fffffff;
        pHVar29->index_left_ = -1;
        pHVar29->index_right_or_value_ = -1;
        pHVar29[1].total_count_ = 0x7fffffff;
        pHVar29[1].index_left_ = -1;
        pHVar29[1].index_right_or_value_ = -1;
        iVar7 = (int)(uVar27 >> 3);
        if (1 < iVar7) {
          uVar8 = iVar7 + 1;
          pHVar29 = pHVar29 + 2;
          uVar18 = 0;
          uVar20 = uVar8;
          do {
            uVar2 = pool[(int)uVar18].total_count_;
            uVar1 = pool[(int)uVar20].total_count_;
            uVar23 = uVar18;
            if (uVar1 < uVar2) {
              uVar23 = uVar20;
            }
            iVar17 = uVar18 + (uVar2 <= uVar1);
            iVar19 = uVar20 + (uVar1 < uVar2);
            uVar1 = pool[iVar17].total_count_;
            uVar20 = pool[iVar19].total_count_;
            iVar26 = iVar17;
            if (uVar20 < uVar1) {
              iVar26 = iVar19;
            }
            uVar18 = iVar17 + (uint)(uVar1 <= uVar20);
            uVar20 = iVar19 + (uint)(uVar20 < uVar1);
            pHVar29[-1].total_count_ = pool[iVar26].total_count_ + pool[(int)uVar23].total_count_;
            pHVar29[-1].index_left_ = (int16_t)uVar23;
            pHVar29[-1].index_right_or_value_ = (int16_t)iVar26;
            pHVar29->total_count_ = 0x7fffffff;
            pHVar29->index_left_ = -1;
            pHVar29->index_right_or_value_ = -1;
            pHVar29 = pHVar29 + 1;
            uVar8 = uVar8 - 1;
          } while (2 < uVar8);
        }
        SetDepth(local_70 + iVar7 * 2,pool,depth,'\0');
        lVar10 = local_38;
        if (1 < uVar9) {
          bVar16 = *depth;
          uVar21 = 0;
          do {
            bVar22 = depth[uVar21 + 1];
            bVar31 = bVar16 < bVar22;
            if (bVar16 <= bVar22) {
              bVar16 = bVar22;
            }
            if (bVar31) {
              pbVar15 = local_40 + uVar21;
            }
            uVar21 = uVar21 + 1;
          } while (uVar24 != uVar21);
        }
      }
      local_cc = local_cc * 2;
    } while (0xe < *pbVar15);
    free(pool);
    ConvertBitDepthsToSymbols(depth,uVar9,local_58);
    uVar21 = local_50;
    if (4 < local_50) {
      uVar21 = *storage_ix;
      uVar27 = uVar21 + 0x28;
      *(ulong *)(storage + (uVar21 >> 3)) =
           0xff55555554 << ((byte)uVar21 & 7) | (ulong)storage[uVar21 >> 3];
      *storage_ix = uVar27;
      if (uVar9 == 0) {
        return;
      }
      uVar21 = 0;
      bVar16 = 8;
      do {
        bVar22 = depth[uVar21];
        uVar30 = uVar21 + 1;
        uVar25 = 1;
        if (uVar30 < uVar9) {
          uVar30 = uVar25;
          do {
            uVar25 = uVar30;
            if (depth[uVar30 + uVar21] != bVar22) break;
            lVar5 = (uVar21 - uVar24) + uVar30;
            uVar30 = uVar30 + 1;
            uVar25 = uVar9 - uVar21;
          } while (lVar5 != 0);
          uVar30 = uVar21 + uVar25;
        }
        if (bVar22 == 0) {
          uVar20 = (&kZeroRepsDepth)[uVar25];
          if ((ulong)(&kZeroRepsBits)[uVar25] >> ((byte)uVar20 & 0x3f) != 0) goto LAB_00177400;
          *(ulong *)(storage + (uVar27 >> 3)) =
               (&kZeroRepsBits)[uVar25] << ((byte)uVar27 & 7) | (ulong)storage[uVar27 >> 3];
          uVar27 = uVar27 + uVar20;
LAB_0017727d:
          *storage_ix = uVar27;
          bVar22 = bVar16;
        }
        else {
          if (bVar16 != bVar22) {
            bVar16 = (&kCodeLengthDepth)[bVar22];
            if ((uint)(&kCodeLengthBits)[bVar22] >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
            *(ulong *)(storage + (uVar27 >> 3)) =
                 (ulong)(uint)(&kCodeLengthBits)[bVar22] << ((byte)uVar27 & 7) |
                 (ulong)storage[uVar27 >> 3];
            uVar27 = uVar27 + bVar16;
            *storage_ix = uVar27;
            uVar25 = uVar25 - 1;
          }
          if (2 < uVar25) {
            uVar20 = (&DAT_001cafe4)[uVar25];
            if (*(ulong *)(kNonZeroRepsDepth + uVar25 * 8 + 0xae8) >> ((byte)uVar20 & 0x3f) == 0) {
              *(ulong *)(storage + (uVar27 >> 3)) =
                   *(ulong *)(kNonZeroRepsDepth + uVar25 * 8 + 0xae8) << ((byte)uVar27 & 7) |
                   (ulong)storage[uVar27 >> 3];
              uVar27 = uVar27 + uVar20;
              bVar16 = bVar22;
              goto LAB_0017727d;
            }
            goto LAB_00177400;
          }
          if (uVar25 != 0) {
            bVar16 = (&kCodeLengthDepth)[bVar22];
            uVar20 = (&kCodeLengthBits)[bVar22];
            do {
              if (uVar20 >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
              uVar21 = uVar27 >> 3;
              bVar6 = (byte)uVar27;
              uVar27 = uVar27 + bVar16;
              *(ulong *)(storage + uVar21) = (ulong)uVar20 << (bVar6 & 7) | (ulong)storage[uVar21];
              *storage_ix = uVar27;
              uVar25 = uVar25 - 1;
            } while (uVar25 != 0);
          }
        }
        uVar21 = uVar30;
        bVar16 = bVar22;
        if (uVar9 <= uVar30) {
          return;
        }
      } while( true );
    }
    uVar9 = *storage_ix;
    *(ulong *)(storage + (uVar9 >> 3)) = (ulong)storage[uVar9 >> 3] | 1L << ((byte)uVar9 & 7);
    uVar24 = uVar9 + 2;
    *storage_ix = uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         local_50 - 1 << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
    uVar9 = uVar9 + 4;
    *storage_ix = uVar9;
    uVar24 = 0;
    do {
      uVar27 = uVar24 + 1;
      if (uVar27 < uVar21) {
        uVar30 = local_98[uVar24];
        uVar25 = uVar27;
        do {
          uVar4 = local_98[uVar25];
          if (depth[uVar4] < depth[uVar30]) {
            local_98[uVar25] = uVar30;
            local_98[uVar24] = uVar4;
            uVar30 = uVar4;
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 < uVar21);
      }
      uVar24 = uVar27;
    } while (uVar27 != uVar21);
    bVar16 = (byte)local_60;
    uVar24 = local_98[0] >> (bVar16 & 0x3f);
    bVar22 = (byte)uVar9;
    if (uVar21 == 2) {
      if (uVar24 != 0) goto LAB_00177400;
      if (0x38 < local_60) goto LAB_0017741f;
      *(ulong *)(storage + (uVar9 >> 3)) = local_98[0] << (bVar22 & 7) | (ulong)storage[uVar9 >> 3];
      uVar9 = uVar9 + local_60;
      *storage_ix = uVar9;
      uVar21 = local_98[1];
    }
    else {
      if (uVar21 != 3) {
        if (uVar24 != 0) goto LAB_00177400;
        if (0x38 < local_60) goto LAB_0017741f;
        *(ulong *)(storage + (uVar9 >> 3)) =
             local_98[0] << (bVar22 & 7) | (ulong)storage[uVar9 >> 3];
        uVar9 = uVar9 + local_60;
        *storage_ix = uVar9;
        if (local_98[1] >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
        *(ulong *)(storage + (uVar9 >> 3)) =
             local_98[1] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        uVar9 = uVar9 + local_60;
        *storage_ix = uVar9;
        if (local_98[2] >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
        *(ulong *)(storage + (uVar9 >> 3)) =
             local_98[2] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        uVar9 = uVar9 + local_60;
        *storage_ix = uVar9;
        if (local_98[3] >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
        *(ulong *)(storage + (uVar9 >> 3)) =
             local_98[3] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
        uVar21 = uVar9 + local_60;
        *storage_ix = uVar21;
        *(ulong *)(storage + (uVar21 >> 3)) =
             (ulong)(depth[local_98[0]] == '\x01') << ((byte)uVar21 & 7) |
             (ulong)storage[uVar21 >> 3];
        sVar28 = local_60 + uVar9 + 1;
        goto LAB_00176b49;
      }
      if (uVar24 != 0) goto LAB_00177400;
      if (0x38 < local_60) goto LAB_0017741f;
      *(ulong *)(storage + (uVar9 >> 3)) = local_98[0] << (bVar22 & 7) | (ulong)storage[uVar9 >> 3];
      uVar9 = uVar9 + local_60;
      *storage_ix = uVar9;
      if (local_98[1] >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
      *(ulong *)(storage + (uVar9 >> 3)) =
           local_98[1] << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
      uVar9 = uVar9 + local_60;
      *storage_ix = uVar9;
      uVar21 = local_98[2];
    }
    max_bits = local_60;
    if (uVar21 >> (bVar16 & 0x3f) != 0) goto LAB_00177400;
  }
  *(ulong *)(storage + (uVar9 >> 3)) = uVar21 << ((byte)uVar9 & 7) | (ulong)storage[uVar9 >> 3];
  sVar28 = max_bits + uVar9;
LAB_00176b49:
  *storage_ix = sVar28;
  return;
}

Assistant:

void BuildAndStoreHuffmanTreeFast(const uint32_t *histogram,
                                  const size_t histogram_total,
                                  const size_t max_bits,
                                  uint8_t* depth,
                                  uint16_t* bits,
                                  size_t* storage_ix,
                                  uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    WriteBits(4, 1, storage_ix, storage);
    WriteBits(max_bits, symbols[0], storage_ix, storage);
    return;
  }

  const size_t max_tree_size = 2 * length + 1;
  HuffmanTree* const tree =
      static_cast<HuffmanTree*>(malloc(max_tree_size * sizeof(HuffmanTree)));
  for (uint32_t count_limit = 1; ; count_limit *= 2) {
    HuffmanTree* node = tree;
    for (size_t i = length; i != 0;) {
      --i;
      if (histogram[i]) {
        if (PREDICT_TRUE(histogram[i] >= count_limit)) {
          *node = HuffmanTree(histogram[i], -1, static_cast<int16_t>(i));
        } else {
          *node = HuffmanTree(count_limit, -1, static_cast<int16_t>(i));
        }
        ++node;
      }
    }
    const int n = static_cast<int>(node - tree);
    std::sort(tree, node, SortHuffmanTree);
    // The nodes are:
    // [0, n): the sorted leaf nodes that we start with.
    // [n]: we add a sentinel here.
    // [n + 1, 2n): new parent nodes are added here, starting from
    //              (n+1). These are naturally in ascending order.
    // [2n]: we add a sentinel at the end as well.
    // There will be (2n+1) elements at the end.
    const HuffmanTree sentinel(std::numeric_limits<int>::max(), -1, -1);
    *node++ = sentinel;
    *node++ = sentinel;

    int i = 0;      // Points to the next leaf node.
    int j = n + 1;  // Points to the next non-leaf node.
    for (int k = n - 1; k > 0; --k) {
      int left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }
      // The sentinel node becomes the parent node.
      node[-1].total_count_ =
          tree[left].total_count_ + tree[right].total_count_;
      node[-1].index_left_ = static_cast<int16_t>(left);
      node[-1].index_right_or_value_ = static_cast<int16_t>(right);
      // Add back the last sentinel node.
      *node++ = sentinel;
    }
    SetDepth(tree[2 * n - 1], &tree[0], depth, 0);
    // We need to pack the Huffman tree in 14 bits.
    // If this was not successful, add fake entities to the lowest values
    // and retry.
    if (PREDICT_TRUE(*std::max_element(&depth[0], &depth[length]) <= 14)) {
      break;
    }
  }
  free(tree);
  ConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    // value of 1 indicates a simple Huffman code
    WriteBits(2, 1, storage_ix, storage);
    WriteBits(2, count - 1, storage_ix, storage);  // NSYM - 1

    // Sort
    for (size_t i = 0; i < count; i++) {
      for (size_t j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          std::swap(symbols[j], symbols[i]);
        }
      }
    }

    if (count == 2) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      WriteBits(max_bits, symbols[0], storage_ix, storage);
      WriteBits(max_bits, symbols[1], storage_ix, storage);
      WriteBits(max_bits, symbols[2], storage_ix, storage);
      WriteBits(max_bits, symbols[3], storage_ix, storage);
      // tree-select
      WriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    // Complex Huffman Tree
    StoreStaticCodeLengthCode(storage_ix, storage);

    // Actual rle coding.
    uint8_t previous_value = 8;
    for (size_t i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      for (size_t k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        WriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                  storage_ix, storage);
      } else {
        if (previous_value != value) {
          WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                    storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            WriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                      storage_ix, storage);
          }
        } else {
          reps -= 3;
          WriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                    storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}